

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashdyn.c
# Opt level: O2

void tommy_hashdyn_resize(tommy_hashdyn *hashdyn,tommy_count_t new_bucket_bit)

{
  uint uVar1;
  long lVar2;
  tommy_node_struct *ptVar3;
  tommy_hashdyn_node *ptVar4;
  tommy_count_t i;
  tommy_hashdyn_node **pptVar5;
  ulong uVar6;
  tommy_hashdyn_node *ptVar7;
  tommy_count_t i_1;
  uint uVar8;
  tommy_node_struct *ptVar9;
  uint uVar10;
  tommy_hashdyn_node **first;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar10 = 1 << ((byte)new_bucket_bit & 0x1f);
  uVar8 = hashdyn->bucket_bit;
  uVar1 = hashdyn->bucket_max;
  pptVar5 = (tommy_hashdyn_node **)lrtr_malloc((ulong)uVar10 * 8);
  if (uVar8 < new_bucket_bit) {
    for (uVar6 = 0; uVar6 != uVar1; uVar6 = uVar6 + 1) {
      pptVar5[uVar6] = (tommy_hashdyn_node *)0x0;
      pptVar5[(int)uVar6 + uVar1] = (tommy_hashdyn_node *)0x0;
      ptVar7 = hashdyn->bucket[uVar6];
      while (ptVar7 != (tommy_hashdyn_node *)0x0) {
        ptVar3 = ptVar7->next;
        uVar8 = ptVar7->key & uVar10 - 1;
        ptVar4 = pptVar5[uVar8];
        if (ptVar4 == (tommy_hashdyn_node *)0x0) {
          ptVar9 = (tommy_node_struct *)(pptVar5 + uVar8);
          ptVar7->prev = ptVar7;
          ptVar7->next = (tommy_node_struct *)0x0;
        }
        else {
          ptVar7->prev = ptVar4->prev;
          ptVar4->prev = ptVar7;
          ptVar7->next = (tommy_node_struct *)0x0;
          ptVar9 = ptVar7->prev;
        }
        ptVar9->next = ptVar7;
        ptVar7 = ptVar3;
      }
    }
  }
  else {
    first = pptVar5;
    for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
      *first = hashdyn->bucket[uVar6];
      tommy_list_concat(first,hashdyn->bucket + (uVar10 + (int)uVar6));
      first = first + 1;
    }
  }
  lrtr_free(hashdyn->bucket);
  hashdyn->bucket_bit = new_bucket_bit;
  hashdyn->bucket_max = uVar10;
  hashdyn->bucket_mask = uVar10 - 1;
  hashdyn->bucket = pptVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void tommy_hashdyn_resize(tommy_hashdyn* hashdyn, tommy_count_t new_bucket_bit)
{
	tommy_count_t bucket_bit;
	tommy_count_t bucket_max;
	tommy_count_t new_bucket_max;
	tommy_count_t new_bucket_mask;
	tommy_hashdyn_node** new_bucket;

	bucket_bit = hashdyn->bucket_bit;
	bucket_max = hashdyn->bucket_max;

	new_bucket_max = 1 << new_bucket_bit;
	new_bucket_mask = new_bucket_max - 1;

	/* allocate the new vector using malloc() and not calloc() */
	/* because data is fully initialized in the update process */
	new_bucket = tommy_cast(tommy_hashdyn_node**, tommy_malloc(new_bucket_max * sizeof(tommy_hashdyn_node*)));

	/* reinsert all the elements */
	if (new_bucket_bit > bucket_bit) {
		tommy_count_t i;

		/* grow */
		for (i = 0; i < bucket_max; ++i) {
			tommy_hashdyn_node* j;

			/* setup the new two buckets */
			new_bucket[i] = 0;
			new_bucket[i + bucket_max] = 0;

			/* reinsert the bucket */
			j = hashdyn->bucket[i];
			while (j) {
				tommy_hashdyn_node* j_next = j->next;
				tommy_count_t pos = j->key & new_bucket_mask;
				if (new_bucket[pos])
					tommy_list_insert_tail_not_empty(new_bucket[pos], j);
				else
					tommy_list_insert_first(&new_bucket[pos], j);
				j = j_next;
			}
		}
	} else {
		tommy_count_t i;

		/* shrink */
		for (i = 0; i < new_bucket_max; ++i) {
			/* setup the new bucket with the lower bucket*/
			new_bucket[i] = hashdyn->bucket[i];

			/* concat the upper bucket */
			tommy_list_concat(&new_bucket[i], &hashdyn->bucket[i + new_bucket_max]);
		}
	}

	tommy_free(hashdyn->bucket);

	/* setup */
	hashdyn->bucket_bit = new_bucket_bit;
	hashdyn->bucket_max = new_bucket_max;
	hashdyn->bucket_mask = new_bucket_mask;
	hashdyn->bucket = new_bucket;
}